

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O1

wstring * ON_UTF8_to_std_wstring_abi_cxx11_
                    (wstring *__return_storage_ptr__,int bTestByteOrder,char *sUTF8,int sUTF8_count,
                    uint *error_status,uint error_mask,ON__UINT32 error_code_point,char **sNextUTF8)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_register_0000008c;
  uint es;
  wstring *local_850;
  char *sNextIn;
  undefined8 local_840;
  wchar_t buffer [512];
  
  local_840 = CONCAT44(in_register_0000008c,error_mask);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  if (sUTF8 != (char *)0x0 && sUTF8_count == -1) {
    sUTF8_count = -1;
    pcVar4 = sUTF8;
    do {
      sUTF8_count = sUTF8_count + 1;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
  }
  buffer[0x1ff] = L'\0';
  local_850 = __return_storage_ptr__;
  if (error_status != (uint *)0x0) {
    *error_status = 0;
  }
  do {
    es = 0;
    sNextIn = (char *)0x0;
    uVar3 = ON_ConvertUTF8ToWideChar
                      (bTestByteOrder,sUTF8,sUTF8_count,buffer,0x1ff,&es,(uint)local_840,
                       error_code_point,&sNextIn);
    uVar5 = uVar3;
    if (0x1ff < uVar3) {
      uVar5 = 0;
    }
    uVar6 = (int)sNextIn - (int)sUTF8;
    if (sNextIn <= sUTF8) {
      uVar6 = 0;
    }
    if (sUTF8 == (char *)0x0) {
      uVar6 = 0;
    }
    buffer[(int)uVar5] = L'\0';
    if (0x1fe < uVar3 - 1) {
      uVar3 = 0;
    }
    if ((int)uVar6 < 1) {
      uVar3 = 0;
    }
    if ((int)uVar3 >= 1) {
      std::__cxx11::wstring::append((wchar_t *)local_850,(ulong)buffer);
      if ((0 < (int)uVar6) && ((es & 2) != 0)) {
        es = es & 0xfffffffd;
      }
    }
    if (error_status != (uint *)0x0) {
      *error_status = *error_status | es;
    }
    sUTF8_count = sUTF8_count - uVar6;
    if ((((int)uVar3 < 1 || (int)uVar6 < 1) || sUTF8_count < 1) || ((es & 3) != 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = true;
      bTestByteOrder = 0;
    }
    sUTF8 = sUTF8 + (int)uVar6;
  } while (bVar2);
  if (sNextUTF8 != (char **)0x0) {
    *sNextUTF8 = sUTF8;
  }
  return local_850;
}

Assistant:

std::wstring ON_UTF8_to_std_wstring(
  int bTestByteOrder,
  const char* sUTF8,
  int sUTF8_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  const char** sNextUTF8
  ) ON_NOEXCEPT
{
  std::wstring str;
  wchar_t buffer[512];
  const int buffer_count = static_cast<int>(sizeof(buffer)/sizeof(buffer[0]));
  unsigned int es;
  const char* sNextIn;

  if ( -1 == sUTF8_count && 0 != sUTF8 )
  {
    for ( sUTF8_count = 0; 0 != sUTF8[sUTF8_count]; sUTF8_count++)
    {
      // empty for body
    }
  }

  buffer[buffer_count-1] = 0;

  if ( 0 != error_status )
    *error_status = 0;

  for(;;)
  {
    es = 0;
    sNextIn = 0;
    int rc = ON_ConvertUTF8ToWideChar(
      bTestByteOrder, sUTF8, sUTF8_count,
      buffer, buffer_count-1,
      &es, error_mask, error_code_point,
      &sNextIn
      );

    // insure buffer[] is null terminated.
    buffer[( rc >= 0 && rc < buffer_count) ? rc : 0] = 0;

    // in_count = number of input sUTF8[] elements that were processed
    int in_count = ( 0 != sNextIn && 0 != sUTF8 && sNextIn > sUTF8 )
      ? static_cast<int>(sNextIn - sUTF8)
      : 0;

    // out_count = number of UTF-8 output values
    int out_count = ( in_count > 0 && rc > 0 && rc < buffer_count) ? rc : 0;

    if ( out_count > 0 )
    {
       try {
        str.append(buffer,out_count);
      } catch (const std::exception& ) {
        es |= 2;
        in_count = 0;
        out_count = 0;
      }
    }

    sUTF8 += in_count;
    sUTF8_count -= in_count;

    if ( 0 != (0x02 & es) && in_count > 0 && out_count > 0 )
    {
      // buffer[] was not long enough and we made progress.
      // Clear bit 2 and allow further processing
      es &= 0xFFFFFFFD;
    }

    if ( 0 != error_status )
      *error_status |= es;

    if ( sUTF8_count > 0 && in_count > 0 && out_count > 0 && 0 == (es & 3) )
    {
      // There were no blocking errors, we made progress, and there is more input
      bTestByteOrder = false;
      continue;
    }

    break; // finished
  }

  if ( sNextUTF8 )
    *sNextUTF8 = sUTF8;

  // On modern compilers, this return will use an efficient rvalue reference.
  return str;
}